

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacMessage.c
# Opt level: O0

_Bool COSE_Mac_encrypt(HCOSE_MAC h,cose_errback *perr)

{
  _Bool _Var1;
  COSE_MacMessage *pcose;
  cose_errback *perr_local;
  HCOSE_MAC h_local;
  
  _Var1 = IsValidMacHandle(h);
  if (_Var1) {
    if (*(long *)(h + 0x58) != 0) {
      _Var1 = _COSE_Mac_compute((COSE_MacMessage *)h,(byte *)0x0,0,"MAC",perr);
      return _Var1;
    }
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_HANDLE;
  }
  return false;
}

Assistant:

bool COSE_Mac_encrypt(HCOSE_MAC h, cose_errback * perr)
{
	COSE_MacMessage * pcose = (COSE_MacMessage *)h;

	CHECK_CONDITION(IsValidMacHandle(h), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(pcose->m_recipientFirst != NULL, COSE_ERR_INVALID_PARAMETER);

		return _COSE_Mac_compute(pcose, NULL, 0, "MAC", perr);

	errorReturn:
		return false;
}